

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

char * __thiscall
duckdb_fmt::v6::internal::float_writer<char>::prettify<char*>(float_writer<char> *this,char *it)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  char *pcVar7;
  byte bVar8;
  int i_1;
  size_t __len;
  uint uVar9;
  byte *__s;
  byte *pbVar10;
  char *pcVar11;
  ulong uVar12;
  long lVar13;
  int i;
  int iVar14;
  
  iVar14 = this->num_digits_;
  uVar4 = *(uint *)&(this->specs_).field_0x4;
  uVar9 = this->exp_ + iVar14;
  if ((char)uVar4 == '\x01') {
    *it = *this->digits_;
    iVar14 = this->num_digits_;
    iVar1 = (this->specs_).precision;
    uVar4 = iVar1 - iVar14;
    bVar8 = (byte)((uint)*(undefined4 *)&(this->specs_).field_0x4 >> 0x1d) & 1 &
            (uVar4 != 0 && iVar14 <= iVar1);
    if ((iVar14 < 2) && (bVar8 == 0)) {
      __s = (byte *)(it + 1);
    }
    else {
      it[1] = this->decimal_point_;
      __s = (byte *)(it + 2);
    }
    iVar14 = this->num_digits_;
    if ((long)iVar14 != 1) {
      pcVar7 = this->digits_;
      lVar13 = 0;
      do {
        __s[lVar13] = pcVar7[lVar13 + 1];
        lVar13 = lVar13 + 1;
      } while ((long)iVar14 + -1 != lVar13);
      __s = __s + lVar13;
    }
    pbVar10 = __s;
    if (bVar8 != 0) {
      pbVar10 = __s + uVar4;
      switchD_01306cb1::default(__s,0x30,(ulong)uVar4);
    }
    *pbVar10 = ((*(uint *)&(this->specs_).field_0x4 >> 0x18 & 1) == 0) << 5 | 0x45;
    pcVar7 = write_exponent<char,char*>(uVar9 - 1,(char *)(pbVar10 + 1));
    return pcVar7;
  }
  if (this->exp_ < 0) {
    if ((int)uVar9 < 1) {
      *it = '0';
      uVar4 = -uVar9;
      uVar12 = (ulong)(uint)this->num_digits_;
      if (uVar12 == 0) {
        uVar6 = (this->specs_).precision;
        uVar5 = uVar4;
        if (SBORROW4(uVar6,uVar4) != (int)(uVar6 + uVar9) < 0) {
          uVar5 = uVar6;
        }
        if (-1 < (int)uVar6) {
          uVar4 = uVar5;
        }
      }
      if ((0 < this->num_digits_) && ((*(uint *)&(this->specs_).field_0x4 & 0x20000000) == 0)) {
        do {
          if (this->digits_[uVar12 - 1] != '0') goto LAB_01290810;
          bVar2 = 1 < (long)uVar12;
          uVar12 = uVar12 - 1;
        } while (bVar2);
        uVar12 = 0;
      }
LAB_01290810:
      iVar14 = (int)uVar12;
      if (iVar14 == 0 && uVar4 == 0) {
        return it + 1;
      }
      it[1] = this->decimal_point_;
      pcVar11 = it + 2;
      pcVar7 = pcVar11;
      if (0 < (int)uVar4) {
        pcVar7 = pcVar11 + uVar4;
        switchD_01306cb1::default(pcVar11,0x30,(ulong)uVar4);
      }
      if (iVar14 == 0) {
        return pcVar7;
      }
      pcVar11 = this->digits_;
      lVar13 = 0;
      do {
        pcVar7[lVar13] = pcVar11[lVar13];
        lVar13 = lVar13 + 1;
      } while (iVar14 != lVar13);
      return pcVar7 + lVar13;
    }
    if ((int)uVar9 < 4 || (uVar4 & 0xff0000) == 0) {
      pcVar7 = this->digits_;
      uVar12 = 0;
      do {
        it[uVar12] = pcVar7[uVar12];
        uVar12 = uVar12 + 1;
      } while (uVar9 != uVar12);
      pcVar7 = it + uVar12;
    }
    else {
      uVar4 = 3;
      if (uVar9 % 3 != 0) {
        uVar4 = uVar9 % 3;
      }
      iVar14 = 0;
      do {
        pcVar7 = it;
        if (0 < iVar14) {
          *it = (this->specs_).field_0x6;
          pcVar7 = it + 1;
        }
        pcVar11 = this->digits_;
        uVar12 = 0;
        do {
          pcVar7[uVar12] = pcVar11[uVar12 + (long)iVar14];
          uVar12 = uVar12 + 1;
        } while (uVar4 != uVar12);
        iVar14 = iVar14 + uVar4;
        it = pcVar7 + uVar12;
        uVar4 = 3;
      } while (iVar14 < (int)uVar9);
      pcVar7 = pcVar7 + uVar12;
    }
    if (((this->specs_).field_0x7 & 0x20) == 0) {
      uVar4 = this->num_digits_;
      uVar12 = (ulong)uVar4;
      if ((int)uVar9 < (int)uVar4) {
        uVar12 = (ulong)(int)uVar4;
        do {
          if (this->digits_[uVar12 - 1] != '0') goto LAB_012908ab;
          uVar12 = uVar12 - 1;
        } while ((long)(ulong)uVar9 < (long)uVar12);
        uVar12 = (ulong)uVar9;
      }
LAB_012908ab:
      uVar4 = (uint)uVar12;
      if (uVar4 != uVar9) {
        *pcVar7 = this->decimal_point_;
        pcVar7 = pcVar7 + 1;
      }
      if (uVar9 == uVar4) {
        return pcVar7;
      }
      pcVar11 = this->digits_;
      lVar13 = 0;
      do {
        pcVar7[lVar13] = pcVar11[lVar13 + (ulong)uVar9];
        lVar13 = lVar13 + 1;
      } while ((long)(int)uVar4 - (ulong)uVar9 != lVar13);
      return pcVar7 + lVar13;
    }
    *pcVar7 = this->decimal_point_;
    pcVar7 = pcVar7 + 1;
    uVar4 = this->num_digits_;
    if (uVar9 != uVar4) {
      pcVar11 = this->digits_;
      lVar13 = 0;
      do {
        pcVar7[lVar13] = pcVar11[lVar13 + (ulong)uVar9];
        lVar13 = lVar13 + 1;
      } while ((long)(int)uVar4 - (ulong)uVar9 != lVar13);
      pcVar7 = pcVar7 + lVar13;
    }
    iVar14 = (this->specs_).precision;
    iVar1 = this->num_digits_;
    uVar4 = iVar14 - iVar1;
    if (uVar4 == 0 || iVar14 < iVar1) {
      return pcVar7;
    }
    if (uVar4 == 0 || iVar14 < iVar1) {
      return pcVar7;
    }
  }
  else {
    if ((int)uVar9 < 4 || (uVar4 & 0xff0000) == 0) {
      pcVar7 = it;
      if (iVar14 != 0) {
        pcVar7 = this->digits_;
        lVar13 = 0;
        do {
          it[lVar13] = pcVar7[lVar13];
          lVar13 = lVar13 + 1;
        } while (iVar14 != lVar13);
        pcVar7 = it + lVar13;
      }
      uVar4 = uVar9 - this->num_digits_;
      it = pcVar7;
      if (uVar4 != 0 && this->num_digits_ <= (int)uVar9) {
        it = pcVar7 + uVar4;
        switchD_01306cb1::default(pcVar7,0x30,(ulong)uVar4);
      }
    }
    else {
      uVar4 = 3;
      if (uVar9 % 3 != 0) {
        uVar4 = uVar9 % 3;
      }
      iVar14 = 0;
      do {
        if (0 < iVar14) {
          *it = (this->specs_).field_0x6;
          it = it + 1;
        }
        uVar5 = this->num_digits_ - iVar14;
        pcVar7 = it;
        uVar6 = uVar4;
        if (uVar5 == 0 || this->num_digits_ < iVar14) {
LAB_0129063b:
          it = pcVar7 + uVar6;
          switchD_01306cb1::default(pcVar7,0x30,(ulong)uVar6);
        }
        else {
          uVar3 = uVar5;
          if ((int)uVar4 < (int)uVar5) {
            uVar3 = uVar4;
          }
          pcVar7 = this->digits_;
          lVar13 = 0;
          do {
            it[lVar13] = pcVar7[lVar13 + iVar14];
            lVar13 = lVar13 + 1;
          } while ((int)uVar3 != lVar13);
          it = it + lVar13;
          if (((int)uVar5 < (int)uVar4) &&
             (uVar6 = uVar4 - uVar3, pcVar7 = it, uVar6 != 0 && (int)uVar3 <= (int)uVar4))
          goto LAB_0129063b;
        }
        iVar14 = iVar14 + uVar4;
        uVar4 = 3;
      } while (iVar14 < (int)uVar9);
    }
    if (((this->specs_).field_0x7 & 0x20) == 0) {
      return it;
    }
    pcVar7 = it + 1;
    *it = this->decimal_point_;
    iVar14 = (this->specs_).precision;
    uVar4 = iVar14 - uVar9;
    if (uVar4 == 0 || iVar14 < (int)uVar9) {
      if ((this->specs_).field_0x4 == '\x02') {
        return pcVar7;
      }
      it[1] = '0';
      return it + 2;
    }
  }
  switchD_01306cb1::default(pcVar7,0x30,(ulong)uVar4);
  return pcVar7 + uVar4;
}

Assistant:

It prettify(It it) const {
    // pow(10, full_exp - 1) <= v <= pow(10, full_exp).
    int full_exp = num_digits_ + exp_;
    if (specs_.format == float_format::exp) {
      // Insert a decimal point after the first digit and add an exponent.
      *it++ = static_cast<Char>(*digits_);
      int num_zeros = specs_.precision - num_digits_;
      bool trailing_zeros = num_zeros > 0 && specs_.trailing_zeros;
      if (num_digits_ > 1 || trailing_zeros) *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + 1, digits_ + num_digits_, it);
      if (trailing_zeros)
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      *it++ = static_cast<Char>(specs_.upper ? 'E' : 'e');
      return write_exponent<Char>(full_exp - 1, it);
    }
    if (num_digits_ <= full_exp) {
      // 1234e7 -> 12340000000[.0+]
      if (specs_.thousand_sep != '\0' && full_exp > 3) {
        // thousand separator
        // we need to print the thousand separator every 3 digits
        // the loop is essentially write 3 digits, write the thousand separator
        // the exception is the first batch of digits which are 1-3 digits
        int digit_count = full_exp % 3 == 0 ? 3 : full_exp % 3;
        for(int i = 0; i < full_exp; i += digit_count, digit_count = 3) {
          if (i > 0) {
            *it++ = specs_.thousand_sep;
          }
          if (i < num_digits_) {
            // we still need to write digits
            int write_count = std::min<int>(num_digits_ - i, digit_count);
            it = copy_str<Char>(digits_ + i, digits_ + i + write_count, it);
            if (write_count < digit_count) {
              // write any trailing zeros that belong to this batch
              it = std::fill_n(it, digit_count - write_count, static_cast<Char>('0'));
            }
          } else {
            // we only need to write trailing zeros
            it = std::fill_n(it, digit_count, static_cast<Char>('0'));
          }
        }
      } else {
        it = copy_str<Char>(digits_, digits_ + num_digits_, it);
        it = std::fill_n(it, full_exp - num_digits_, static_cast<Char>('0'));
      }
      if (specs_.trailing_zeros) {
        *it++ = decimal_point_;
        int num_zeros = specs_.precision - full_exp;
        if (num_zeros <= 0) {
          if (specs_.format != float_format::fixed)
            *it++ = static_cast<Char>('0');
          return it;
        }
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
        if (num_zeros > 1000)
          throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else if (full_exp > 0) {
      // 1234e-2 -> 12.34[0+]
      if (specs_.thousand_sep != '\0' && full_exp > 3) {
        // thousand separator
        // we need to print the thousand separator every 3 digits
        // the loop is essentially write 3 digits, write the thousand separator
        // the exception is the first batch of digits which are 1-3 digits
        int digit_count = full_exp % 3 == 0 ? 3 : full_exp % 3;
        for(int i = 0; i < full_exp; i += digit_count, digit_count = 3) {
          if (i > 0) {
            *it++ = specs_.thousand_sep;
          }
          it = copy_str<Char>(digits_ + i, digits_ + i + digit_count, it);
        }
      } else {
        it = copy_str<Char>(digits_, digits_ + full_exp, it);
      }
      if (!specs_.trailing_zeros) {
        // Remove trailing zeros.
        int num_digits = num_digits_;
        while (num_digits > full_exp && digits_[num_digits - 1] == '0')
          --num_digits;
        if (num_digits != full_exp) *it++ = decimal_point_;
        return copy_str<Char>(digits_ + full_exp, digits_ + num_digits, it);
      }
      *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + full_exp, digits_ + num_digits_, it);
      if (specs_.precision > num_digits_) {
        // Add trailing zeros.
        int num_zeros = specs_.precision - num_digits_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else {
      // 1234e-6 -> 0.001234
      *it++ = static_cast<Char>('0');
      int num_zeros = -full_exp;
      if (num_digits_ == 0 && specs_.precision >= 0 && specs_.precision < num_zeros)
        num_zeros = specs_.precision;
      int num_digits = num_digits_;
      if (!specs_.trailing_zeros)
        while (num_digits > 0 && digits_[num_digits - 1] == '0') --num_digits;
      if (num_zeros != 0 || num_digits != 0) {
        *it++ = decimal_point_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
        it = copy_str<Char>(digits_, digits_ + num_digits, it);
      }
    }
    return it;
  }